

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMAttrMapImpl::removeNamedItemNS
          (DOMAttrMapImpl *this,XMLCh *namespaceURI,XMLCh *localName)

{
  DOMNodeVector *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  long lVar5;
  long lVar6;
  undefined4 extraout_var_00;
  undefined8 uVar7;
  DOMException *this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong index;
  DOMNode *pDVar8;
  MemoryManager **ppMVar9;
  
  bVar1 = readOnly(this);
  if (bVar1) {
    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
    ppMVar9 = &XMLPlatformUtils::fgMemoryManager;
    if (this->fOwnerNode != (DOMNode *)0x0) {
      iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_01,iVar3) != 0) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        ppMVar9 = (MemoryManager **)(CONCAT44(extraout_var_02,iVar3) + 0x158);
      }
    }
    DOMException::DOMException(this_01,7,0,*ppMVar9);
  }
  else {
    uVar2 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xf])(this,namespaceURI,localName)
    ;
    if ((int)uVar2 < 0) {
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      ppMVar9 = &XMLPlatformUtils::fgMemoryManager;
      if (this->fOwnerNode != (DOMNode *)0x0) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_03,iVar3) != 0) {
          iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
          ppMVar9 = (MemoryManager **)(CONCAT44(extraout_var_04,iVar3) + 0x158);
        }
      }
      DOMException::DOMException(this_01,8,0,*ppMVar9);
    }
    else {
      this_00 = this->fNodes;
      index = (ulong)uVar2;
      if (index < this_00->nextFreeSlot) {
        pDVar8 = this_00->data[index];
      }
      else {
        pDVar8 = (DOMNode *)0x0;
      }
      DOMNodeVector::removeElementAt(this_00,index);
      iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      lVar6 = CONCAT44(extraout_var,iVar3) + 0x18;
      if (CONCAT44(extraout_var,iVar3) == 0) {
        lVar6 = 0;
      }
      if (pDVar8 == (DOMNode *)0x0) {
        plVar4 = (long *)0x0;
      }
      else {
        plVar4 = (long *)__dynamic_cast(pDVar8,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                        0xfffffffffffffffe);
      }
      if (plVar4 != (long *)0x0) {
        lVar5 = (**(code **)(*plVar4 + 0x10))(plVar4);
        if (lVar5 != 0) {
          lVar5 = (**(code **)(*plVar4 + 0x10))(plVar4);
          *(long *)(lVar5 + 8) = lVar6;
          if (pDVar8 == (DOMNode *)0x0) {
            plVar4 = (long *)0x0;
          }
          else {
            plVar4 = (long *)__dynamic_cast(pDVar8,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                            0xfffffffffffffffe);
          }
          if (plVar4 != (long *)0x0) {
            lVar6 = (**(code **)(*plVar4 + 0x10))(plVar4);
            if (lVar6 != 0) {
              lVar6 = (**(code **)(*plVar4 + 0x10))(plVar4);
              *(ushort *)(lVar6 + 0x10) = *(ushort *)(lVar6 + 0x10) & 0xfff7;
              iVar3 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xc])(this);
              if ((pDVar8 != (DOMNode *)0x0) && ((char)iVar3 != '\0')) {
                iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0x4a])();
                plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x38))
                                           ((long *)CONCAT44(extraout_var_00,iVar3),namespaceURI,
                                            localName);
                if (plVar4 != (long *)0x0) {
                  uVar7 = (**(code **)(*plVar4 + 0x68))(plVar4,1);
                  (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[8])(this,uVar7);
                }
              }
              return pDVar8;
            }
          }
          this_01 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
          goto LAB_00263a94;
        }
      }
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
    }
  }
LAB_00263a94:
  __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMAttrMapImpl::removeNamedItemNS(const XMLCh *namespaceURI, const XMLCh *localName)
{
    if (this->readOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    int i = findNamePoint(namespaceURI, localName);
    if (i < 0)
        throw DOMException(DOMException::NOT_FOUND_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    DOMNode * removed = fNodes -> elementAt(i);
    fNodes -> removeElementAt(i);	//remove n from nodes
    castToNodeImpl(removed)->fOwnerNode = fOwnerNode->getOwnerDocument();
    castToNodeImpl(removed)->isOwned(false);

    // Replace it if it had a default value
    // (DOM spec level 2 - Element Interface)

    if (hasDefaults() && (removed != 0))
    {
        DOMAttrMapImpl* defAttrs = ((DOMElementImpl*)fOwnerNode)->getDefaultAttributes();
        DOMAttr* attr = (DOMAttr*)(defAttrs->getNamedItemNS(namespaceURI, localName));
        if (attr != 0)
        {
            DOMAttr* newAttr = (DOMAttr*)attr->cloneNode(true);
            setNamedItemNS(newAttr);
        }
    }

    return removed;
}